

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_freeCDict(ZSTD_CDict *cdict)

{
  ZSTD_customMem customMem;
  ZSTD_customMem customMem_00;
  ZSTD_customMem customMem_01;
  long in_RDI;
  ZSTD_customMem cMem;
  undefined8 in_stack_ffffffffffffffd0;
  undefined8 uVar1;
  void *ptr;
  
  if (in_RDI != 0) {
    uVar1 = *(undefined8 *)(in_RDI + 0x12e0);
    ptr = *(void **)(in_RDI + 0x12e8);
    customMem.customFree = (ZSTD_freeFunction)uVar1;
    customMem.customAlloc = (ZSTD_allocFunction)in_stack_ffffffffffffffd0;
    customMem.opaque = ptr;
    ZSTD_free(ptr,customMem);
    customMem_00.customFree = (ZSTD_freeFunction)uVar1;
    customMem_00.customAlloc = (ZSTD_allocFunction)in_stack_ffffffffffffffd0;
    customMem_00.opaque = ptr;
    ZSTD_free(ptr,customMem_00);
    customMem_01.customFree = (ZSTD_freeFunction)uVar1;
    customMem_01.customAlloc = (ZSTD_allocFunction)in_stack_ffffffffffffffd0;
    customMem_01.opaque = ptr;
    ZSTD_free(ptr,customMem_01);
  }
  return 0;
}

Assistant:

size_t ZSTD_freeCDict(ZSTD_CDict* cdict)
{
    if (cdict==NULL) return 0;   /* support free on NULL */
    {   ZSTD_customMem const cMem = cdict->customMem;
        ZSTD_free(cdict->workspace, cMem);
        ZSTD_free(cdict->dictBuffer, cMem);
        ZSTD_free(cdict, cMem);
        return 0;
    }
}